

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O3

float kernel_function(flat_example *fec1,flat_example *fec2,void *params,size_t kernel_type)

{
  int iVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  
  if (kernel_type == 0) {
    fVar3 = linear_kernel(fec1,fec2);
    return fVar3;
  }
  if (kernel_type == 2) {
    iVar1 = *params;
    fVar3 = linear_kernel(fec1,fec2);
    dVar4 = pow((double)(fVar3 + 1.0),(double)iVar1);
    fVar3 = (float)dVar4;
  }
  else {
    fVar3 = 0.0;
    if (kernel_type == 1) {
      fVar3 = *params;
      fVar2 = linear_kernel(fec1,fec2);
      fVar3 = expf(-((fec1->total_sum_feat_sq + fec2->total_sum_feat_sq) - (fVar2 + fVar2)) * fVar3)
      ;
      return fVar3;
    }
  }
  return fVar3;
}

Assistant:

float kernel_function(const flat_example* fec1, const flat_example* fec2, void* params, size_t kernel_type)
{
  switch (kernel_type)
  {
    case SVM_KER_RBF:
      return rbf_kernel(fec1, fec2, *((float*)params));
    case SVM_KER_POLY:
      return poly_kernel(fec1, fec2, *((int*)params));
    case SVM_KER_LIN:
      return linear_kernel(fec1, fec2);
  }
  return 0;
}